

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgtransport.c
# Opt level: O0

void mg_raw_transport_suspend_until_ready_to_read(mg_transport *transport)

{
  mg_transport *transport_local;
  
  return;
}

Assistant:

void mg_raw_transport_suspend_until_ready_to_read(
    struct mg_transport *transport) {
#ifdef __EMSCRIPTEN__
  const int sock = ((mg_raw_transport *)transport)->sockfd;
  mg_wasm_suspend_until_ready_to_read(sock);
#else
  (void)transport;
#endif
}